

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadConfigCfg.h
# Opt level: O3

void __thiscall
ConfigManager::Concretions::ReadConfigCfg::ReadConfigCfg(ReadConfigCfg *this,string *file_path)

{
  (this->
  super_IReadConfig<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).m_file_path._M_dataplus._M_p =
       (pointer)&(this->
                 super_IReadConfig<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ).m_file_path.field_2;
  (this->
  super_IReadConfig<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).m_file_path._M_string_length = 0;
  (this->
  super_IReadConfig<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).m_file_path.field_2._M_local_buf[0] = '\0';
  (this->
  super_IReadConfig<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  )._vptr_IReadConfig = (_func_int **)&PTR__IReadConfig_00139cb0;
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->
              super_IReadConfig<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_file_path);
  return;
}

Assistant:

explicit ReadConfigCfg(std::string file_path)
        {
            m_file_path = file_path;
        }